

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 (*pauVar67) [16];
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  undefined1 (*pauVar71) [16];
  long lVar72;
  ulong uVar73;
  RTCRayQueryContext *pRVar74;
  uint uVar75;
  ulong *puVar76;
  ulong uVar77;
  undefined1 (*pauVar78) [16];
  ulong uVar79;
  long lVar80;
  undefined1 (*pauVar81) [16];
  ulong uVar82;
  long lVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  float fVar87;
  float fVar94;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar92;
  float fVar93;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar91 [64];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar108;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar107;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar113;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar131;
  float fVar132;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar123 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar122 [16];
  undefined1 auVar126 [32];
  float fVar133;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar137 [16];
  undefined1 auVar139 [32];
  undefined1 auVar138 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar143;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar204;
  float fVar205;
  float fVar209;
  float fVar210;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar208 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  float fVar217;
  float fVar219;
  undefined1 auVar218 [64];
  float fVar220;
  float fVar221;
  undefined1 auVar222 [32];
  float fVar226;
  float fVar228;
  float fVar230;
  float fVar232;
  float fVar234;
  float fVar236;
  undefined1 auVar223 [32];
  float fVar225;
  float fVar227;
  float fVar229;
  float fVar231;
  float fVar233;
  float fVar235;
  undefined1 auVar224 [64];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  float fVar241;
  undefined1 auVar242 [32];
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar243 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2944;
  undefined1 local_2940 [32];
  RTCFilterFunctionNArguments local_2910;
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  float fStack_28c4;
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  float fStack_28a4;
  long local_2888;
  Scene *local_2880;
  ulong local_2878;
  float local_2870;
  float local_286c;
  float local_2868;
  undefined4 local_2864;
  undefined4 local_2860;
  undefined4 local_285c;
  uint local_2858;
  uint local_2854;
  uint local_2850;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  float local_2660 [4];
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  undefined4 uStack_2644;
  float local_2640 [4];
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  undefined4 uStack_2624;
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar71 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar123 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    auVar109 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar88._8_4_ = 0x7fffffff;
    auVar88._0_8_ = 0x7fffffff7fffffff;
    auVar88._12_4_ = 0x7fffffff;
    auVar88 = vandps_avx((undefined1  [16])aVar3,auVar88);
    auVar144._8_4_ = 0x219392ef;
    auVar144._0_8_ = 0x219392ef219392ef;
    auVar144._12_4_ = 0x219392ef;
    auVar88 = vcmpps_avx(auVar88,auVar144,1);
    auVar88 = vblendvps_avx((undefined1  [16])aVar3,auVar144,auVar88);
    auVar144 = vrcpps_avx(auVar88);
    fVar142 = auVar144._0_4_;
    auVar118._0_4_ = auVar88._0_4_ * fVar142;
    fVar24 = auVar144._4_4_;
    auVar118._4_4_ = auVar88._4_4_ * fVar24;
    fVar25 = auVar144._8_4_;
    auVar118._8_4_ = auVar88._8_4_ * fVar25;
    fVar26 = auVar144._12_4_;
    auVar118._12_4_ = auVar88._12_4_ * fVar26;
    auVar145._8_4_ = 0x3f800000;
    auVar145._0_8_ = 0x3f8000003f800000;
    auVar145._12_4_ = 0x3f800000;
    auVar88 = vsubps_avx(auVar145,auVar118);
    uVar2 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_2560._4_4_ = uVar2;
    local_2560._0_4_ = uVar2;
    local_2560._8_4_ = uVar2;
    local_2560._12_4_ = uVar2;
    local_2560._16_4_ = uVar2;
    local_2560._20_4_ = uVar2;
    local_2560._24_4_ = uVar2;
    local_2560._28_4_ = uVar2;
    auVar216 = ZEXT3264(local_2560);
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2580._4_4_ = uVar2;
    local_2580._0_4_ = uVar2;
    local_2580._8_4_ = uVar2;
    local_2580._12_4_ = uVar2;
    local_2580._16_4_ = uVar2;
    local_2580._20_4_ = uVar2;
    local_2580._24_4_ = uVar2;
    local_2580._28_4_ = uVar2;
    auVar218 = ZEXT3264(local_2580);
    auVar119._0_4_ = fVar142 + fVar142 * auVar88._0_4_;
    auVar119._4_4_ = fVar24 + fVar24 * auVar88._4_4_;
    auVar119._8_4_ = fVar25 + fVar25 * auVar88._8_4_;
    auVar119._12_4_ = fVar26 + fVar26 * auVar88._12_4_;
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_25a0._4_4_ = uVar2;
    local_25a0._0_4_ = uVar2;
    local_25a0._8_4_ = uVar2;
    local_25a0._12_4_ = uVar2;
    local_25a0._16_4_ = uVar2;
    local_25a0._20_4_ = uVar2;
    local_25a0._24_4_ = uVar2;
    local_25a0._28_4_ = uVar2;
    auVar224 = ZEXT3264(local_25a0);
    auVar88 = vshufps_avx(auVar119,auVar119,0);
    local_25c0._16_16_ = auVar88;
    local_25c0._0_16_ = auVar88;
    auVar238 = ZEXT3264(local_25c0);
    auVar88 = vmovshdup_avx(auVar119);
    auVar144 = vshufps_avx(auVar119,auVar119,0x55);
    local_25e0._16_16_ = auVar144;
    local_25e0._0_16_ = auVar144;
    auVar240 = ZEXT3264(local_25e0);
    auVar144 = vshufpd_avx(auVar119,auVar119,1);
    auVar118 = vshufps_avx(auVar119,auVar119,0xaa);
    local_2600._16_16_ = auVar118;
    local_2600._0_16_ = auVar118;
    auVar243 = ZEXT3264(local_2600);
    uVar82 = (ulong)(auVar119._0_4_ < 0.0) * 8;
    uVar70 = (ulong)(auVar88._0_4_ < 0.0);
    lVar1 = uVar70 * 8;
    local_2878 = (ulong)(auVar144._0_4_ < 0.0) * 8 + 0x20;
    auVar88 = vshufps_avx(auVar123,auVar123,0);
    local_23e0._16_16_ = auVar88;
    local_23e0._0_16_ = auVar88;
    auVar88 = vshufps_avx(auVar109,auVar109,0);
    auVar91 = ZEXT3264(CONCAT1616(auVar88,auVar88));
    uVar84 = uVar82 ^ 8;
    uVar85 = lVar1 + 0x10U ^ 8;
    uVar86 = local_2878 ^ 8;
    local_2540 = mm_lookupmask_ps._0_8_;
    uStack_2538 = mm_lookupmask_ps._8_8_;
    uStack_2530 = mm_lookupmask_ps._240_8_;
    uStack_2528 = mm_lookupmask_ps._248_8_;
LAB_014e00de:
    do {
      pauVar67 = pauVar71 + -1;
      pauVar71 = pauVar71 + -1;
      if (*(float *)(*pauVar67 + 8) <= (ray->super_RayK<1>).tfar) {
        pauVar67 = pauVar71;
        uVar79 = *(ulong *)*pauVar71;
        while (pauVar71 = pauVar67, (uVar79 & 8) == 0) {
          uVar73 = uVar79 & 0xfffffffffffffff0;
          puVar76 = (ulong *)(uVar73 + 0x40);
          if (uVar73 == 0) {
            puVar76 = (ulong *)0x0;
          }
          auVar123._8_8_ = 0;
          auVar123._0_8_ = *puVar76;
          auVar120._8_8_ = 0;
          auVar120._0_8_ = puVar76[1];
          auVar88 = vpminub_avx(auVar123,auVar120);
          auVar88 = vpcmpeqb_avx(auVar123,auVar88);
          auVar109._8_8_ = 0;
          auVar109._0_8_ = *(ulong *)((long)puVar76 + 4);
          auVar137._8_8_ = 0;
          auVar137._0_8_ = *(ulong *)((long)puVar76 + 0xc);
          auVar123 = vpminub_avx(auVar109,auVar137);
          auVar123 = vpcmpeqb_avx(auVar109,auVar123);
          fVar142 = *(float *)(puVar76 + 6);
          fVar24 = *(float *)((long)puVar76 + 0x3c);
          auVar121._8_8_ = 0;
          auVar121._0_8_ = puVar76[auVar119._0_4_ < 0.0];
          auVar109 = vpmovzxbd_avx(auVar121);
          auVar163._8_8_ = 0;
          auVar163._0_8_ = *(ulong *)((long)puVar76 + uVar82 + 4);
          auVar144 = vpmovzxbd_avx(auVar163);
          auVar124._16_16_ = auVar144;
          auVar124._0_16_ = auVar109;
          auVar124 = vcvtdq2ps_avx(auVar124);
          auVar125._0_4_ = fVar142 + fVar24 * auVar124._0_4_;
          auVar125._4_4_ = fVar142 + fVar24 * auVar124._4_4_;
          auVar125._8_4_ = fVar142 + fVar24 * auVar124._8_4_;
          auVar125._12_4_ = fVar142 + fVar24 * auVar124._12_4_;
          auVar125._16_4_ = fVar142 + fVar24 * auVar124._16_4_;
          auVar125._20_4_ = fVar142 + fVar24 * auVar124._20_4_;
          auVar125._24_4_ = fVar142 + fVar24 * auVar124._24_4_;
          auVar125._28_4_ = fVar142 + auVar124._28_4_;
          auVar164._8_8_ = 0;
          auVar164._0_8_ = *(ulong *)((long)puVar76 + uVar84);
          auVar109 = vpmovzxbd_avx(auVar164);
          auVar169._8_8_ = 0;
          auVar169._0_8_ = *(ulong *)((long)puVar76 + uVar84 + 4);
          auVar144 = vpmovzxbd_avx(auVar169);
          auVar165._16_16_ = auVar144;
          auVar165._0_16_ = auVar109;
          auVar124 = vcvtdq2ps_avx(auVar165);
          auVar139._0_4_ = fVar142 + fVar24 * auVar124._0_4_;
          auVar139._4_4_ = fVar142 + fVar24 * auVar124._4_4_;
          auVar139._8_4_ = fVar142 + fVar24 * auVar124._8_4_;
          auVar139._12_4_ = fVar142 + fVar24 * auVar124._12_4_;
          auVar139._16_4_ = fVar142 + fVar24 * auVar124._16_4_;
          auVar139._20_4_ = fVar142 + fVar24 * auVar124._20_4_;
          auVar139._24_4_ = fVar142 + fVar24 * auVar124._24_4_;
          auVar139._28_4_ = fVar142 + fVar24;
          fVar142 = *(float *)((long)puVar76 + 0x34);
          fVar24 = *(float *)(puVar76 + 8);
          auVar146._8_8_ = 0;
          auVar146._0_8_ = puVar76[uVar70 + 2];
          auVar109 = vpmovzxbd_avx(auVar146);
          auVar178._8_8_ = 0;
          auVar178._0_8_ = *(ulong *)((long)puVar76 + lVar1 + 0x14);
          auVar144 = vpmovzxbd_avx(auVar178);
          auVar147._16_16_ = auVar144;
          auVar147._0_16_ = auVar109;
          auVar124 = vcvtdq2ps_avx(auVar147);
          auVar148._0_4_ = fVar142 + fVar24 * auVar124._0_4_;
          auVar148._4_4_ = fVar142 + fVar24 * auVar124._4_4_;
          auVar148._8_4_ = fVar142 + fVar24 * auVar124._8_4_;
          auVar148._12_4_ = fVar142 + fVar24 * auVar124._12_4_;
          auVar148._16_4_ = fVar142 + fVar24 * auVar124._16_4_;
          auVar148._20_4_ = fVar142 + fVar24 * auVar124._20_4_;
          auVar148._24_4_ = fVar142 + fVar24 * auVar124._24_4_;
          auVar148._28_4_ = fVar142 + auVar124._28_4_;
          auVar179._8_8_ = 0;
          auVar179._0_8_ = *(ulong *)((long)puVar76 + uVar85);
          auVar109 = vpmovzxbd_avx(auVar179);
          auVar206._8_8_ = 0;
          auVar206._0_8_ = *(ulong *)((long)puVar76 + uVar85 + 4);
          auVar144 = vpmovzxbd_avx(auVar206);
          auVar182._16_16_ = auVar144;
          auVar182._0_16_ = auVar109;
          auVar124 = vcvtdq2ps_avx(auVar182);
          auVar166._0_4_ = fVar142 + auVar124._0_4_ * fVar24;
          auVar166._4_4_ = fVar142 + auVar124._4_4_ * fVar24;
          auVar166._8_4_ = fVar142 + auVar124._8_4_ * fVar24;
          auVar166._12_4_ = fVar142 + auVar124._12_4_ * fVar24;
          auVar166._16_4_ = fVar142 + auVar124._16_4_ * fVar24;
          auVar166._20_4_ = fVar142 + auVar124._20_4_ * fVar24;
          auVar166._24_4_ = fVar142 + auVar124._24_4_ * fVar24;
          auVar166._28_4_ = fVar142 + fVar24;
          auVar170._8_8_ = 0;
          auVar170._0_8_ = *(ulong *)((long)puVar76 + local_2878);
          auVar109 = vpmovzxbd_avx(auVar170);
          auVar180._8_8_ = 0;
          auVar180._0_8_ = *(ulong *)((long)puVar76 + local_2878 + 4);
          auVar144 = vpmovzxbd_avx(auVar180);
          auVar171._16_16_ = auVar144;
          auVar171._0_16_ = auVar109;
          auVar181._8_8_ = 0;
          auVar181._0_8_ = *(ulong *)((long)puVar76 + uVar86);
          auVar109 = vpmovzxbd_avx(auVar181);
          auVar207._8_8_ = 0;
          auVar207._0_8_ = *(ulong *)((long)puVar76 + uVar86 + 4);
          auVar144 = vpmovzxbd_avx(auVar207);
          auVar183._16_16_ = auVar144;
          auVar183._0_16_ = auVar109;
          fVar142 = *(float *)((long)puVar76 + 0x44);
          auVar124 = vcvtdq2ps_avx(auVar171);
          auVar23 = vcvtdq2ps_avx(auVar183);
          fVar24 = *(float *)(puVar76 + 7);
          auVar172._0_4_ = fVar24 + fVar142 * auVar124._0_4_;
          auVar172._4_4_ = fVar24 + fVar142 * auVar124._4_4_;
          auVar172._8_4_ = fVar24 + fVar142 * auVar124._8_4_;
          auVar172._12_4_ = fVar24 + fVar142 * auVar124._12_4_;
          auVar172._16_4_ = fVar24 + fVar142 * auVar124._16_4_;
          auVar172._20_4_ = fVar24 + fVar142 * auVar124._20_4_;
          auVar172._24_4_ = fVar24 + fVar142 * auVar124._24_4_;
          auVar172._28_4_ = fVar24 + auVar124._28_4_;
          auVar184._0_4_ = fVar24 + fVar142 * auVar23._0_4_;
          auVar184._4_4_ = fVar24 + fVar142 * auVar23._4_4_;
          auVar184._8_4_ = fVar24 + fVar142 * auVar23._8_4_;
          auVar184._12_4_ = fVar24 + fVar142 * auVar23._12_4_;
          auVar184._16_4_ = fVar24 + fVar142 * auVar23._16_4_;
          auVar184._20_4_ = fVar24 + fVar142 * auVar23._20_4_;
          auVar184._24_4_ = fVar24 + fVar142 * auVar23._24_4_;
          auVar184._28_4_ = fVar24 + auVar23._28_4_;
          auVar124 = vsubps_avx(auVar125,auVar216._0_32_);
          auVar23._4_4_ = auVar238._4_4_ * auVar124._4_4_;
          auVar23._0_4_ = auVar238._0_4_ * auVar124._0_4_;
          auVar23._8_4_ = auVar238._8_4_ * auVar124._8_4_;
          auVar23._12_4_ = auVar238._12_4_ * auVar124._12_4_;
          auVar23._16_4_ = auVar238._16_4_ * auVar124._16_4_;
          auVar23._20_4_ = auVar238._20_4_ * auVar124._20_4_;
          auVar23._24_4_ = auVar238._24_4_ * auVar124._24_4_;
          auVar23._28_4_ = auVar124._28_4_;
          auVar124 = vsubps_avx(auVar148,auVar218._0_32_);
          auVar27._4_4_ = auVar240._4_4_ * auVar124._4_4_;
          auVar27._0_4_ = auVar240._0_4_ * auVar124._0_4_;
          auVar27._8_4_ = auVar240._8_4_ * auVar124._8_4_;
          auVar27._12_4_ = auVar240._12_4_ * auVar124._12_4_;
          auVar27._16_4_ = auVar240._16_4_ * auVar124._16_4_;
          auVar27._20_4_ = auVar240._20_4_ * auVar124._20_4_;
          auVar27._24_4_ = auVar240._24_4_ * auVar124._24_4_;
          auVar27._28_4_ = auVar124._28_4_;
          auVar124 = vmaxps_avx(auVar23,auVar27);
          auVar23 = vsubps_avx(auVar172,auVar224._0_32_);
          auVar28._4_4_ = auVar243._4_4_ * auVar23._4_4_;
          auVar28._0_4_ = auVar243._0_4_ * auVar23._0_4_;
          auVar28._8_4_ = auVar243._8_4_ * auVar23._8_4_;
          auVar28._12_4_ = auVar243._12_4_ * auVar23._12_4_;
          auVar28._16_4_ = auVar243._16_4_ * auVar23._16_4_;
          auVar28._20_4_ = auVar243._20_4_ * auVar23._20_4_;
          auVar28._24_4_ = auVar243._24_4_ * auVar23._24_4_;
          auVar28._28_4_ = auVar23._28_4_;
          auVar23 = vmaxps_avx(auVar28,local_23e0);
          local_27c0 = vmaxps_avx(auVar124,auVar23);
          auVar124 = vsubps_avx(auVar139,auVar216._0_32_);
          auVar29._4_4_ = auVar238._4_4_ * auVar124._4_4_;
          auVar29._0_4_ = auVar238._0_4_ * auVar124._0_4_;
          auVar29._8_4_ = auVar238._8_4_ * auVar124._8_4_;
          auVar29._12_4_ = auVar238._12_4_ * auVar124._12_4_;
          auVar29._16_4_ = auVar238._16_4_ * auVar124._16_4_;
          auVar29._20_4_ = auVar238._20_4_ * auVar124._20_4_;
          auVar29._24_4_ = auVar238._24_4_ * auVar124._24_4_;
          auVar29._28_4_ = auVar124._28_4_;
          auVar124 = vsubps_avx(auVar166,auVar218._0_32_);
          auVar30._4_4_ = auVar240._4_4_ * auVar124._4_4_;
          auVar30._0_4_ = auVar240._0_4_ * auVar124._0_4_;
          auVar30._8_4_ = auVar240._8_4_ * auVar124._8_4_;
          auVar30._12_4_ = auVar240._12_4_ * auVar124._12_4_;
          auVar30._16_4_ = auVar240._16_4_ * auVar124._16_4_;
          auVar30._20_4_ = auVar240._20_4_ * auVar124._20_4_;
          auVar30._24_4_ = auVar240._24_4_ * auVar124._24_4_;
          auVar30._28_4_ = auVar124._28_4_;
          auVar124 = vminps_avx(auVar29,auVar30);
          auVar23 = vsubps_avx(auVar184,auVar224._0_32_);
          auVar31._4_4_ = auVar243._4_4_ * auVar23._4_4_;
          auVar31._0_4_ = auVar243._0_4_ * auVar23._0_4_;
          auVar31._8_4_ = auVar243._8_4_ * auVar23._8_4_;
          auVar31._12_4_ = auVar243._12_4_ * auVar23._12_4_;
          auVar31._16_4_ = auVar243._16_4_ * auVar23._16_4_;
          auVar31._20_4_ = auVar243._20_4_ * auVar23._20_4_;
          auVar31._24_4_ = auVar243._24_4_ * auVar23._24_4_;
          auVar31._28_4_ = auVar23._28_4_;
          auVar23 = vminps_avx(auVar31,auVar91._0_32_);
          auVar23 = vminps_avx(auVar124,auVar23);
          auVar124 = vcmpps_avx(local_27c0,auVar23,2);
          auVar109 = vpcmpeqd_avx(auVar23._0_16_,auVar23._0_16_);
          auVar88 = vpmovsxbd_avx(auVar88 ^ auVar109);
          auVar123 = vpmovsxbd_avx(auVar123 ^ auVar109);
          auVar101._16_16_ = auVar123;
          auVar101._0_16_ = auVar88;
          auVar23 = vcvtdq2ps_avx(auVar101);
          auVar111._8_4_ = 0xbf800000;
          auVar111._0_8_ = 0xbf800000bf800000;
          auVar111._12_4_ = 0xbf800000;
          auVar111._16_4_ = 0xbf800000;
          auVar111._20_4_ = 0xbf800000;
          auVar111._24_4_ = 0xbf800000;
          auVar111._28_4_ = 0xbf800000;
          auVar23 = vcmpps_avx(auVar111,auVar23,1);
          auVar124 = vandps_avx(auVar124,auVar23);
          uVar75 = vmovmskps_avx(auVar124);
          if (uVar75 == 0) {
            if (pauVar71 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014e00de;
          }
          uVar75 = uVar75 & 0xff;
          lVar83 = 0;
          if (uVar75 != 0) {
            for (; (uVar75 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
            }
          }
          uVar79 = *(ulong *)(uVar73 + lVar83 * 8);
          uVar75 = uVar75 - 1 & uVar75;
          pauVar67 = pauVar71;
          if (uVar75 != 0) {
            uVar69 = *(uint *)(local_27c0 + lVar83 * 4);
            lVar83 = 0;
            if (uVar75 != 0) {
              for (; (uVar75 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
              }
            }
            uVar77 = *(ulong *)(uVar73 + lVar83 * 8);
            uVar68 = *(uint *)(local_27c0 + lVar83 * 4);
            uVar75 = uVar75 - 1 & uVar75;
            if (uVar75 == 0) {
              pauVar67 = pauVar71 + 1;
              if (uVar69 < uVar68) {
                *(ulong *)*pauVar71 = uVar77;
                *(uint *)(*pauVar71 + 8) = uVar68;
              }
              else {
                *(ulong *)*pauVar71 = uVar79;
                *(uint *)(*pauVar71 + 8) = uVar69;
                uVar79 = uVar77;
              }
            }
            else {
              auVar99._8_8_ = 0;
              auVar99._0_8_ = uVar79;
              auVar88 = vpunpcklqdq_avx(auVar99,ZEXT416(uVar69));
              auVar110._8_8_ = 0;
              auVar110._0_8_ = uVar77;
              auVar123 = vpunpcklqdq_avx(auVar110,ZEXT416(uVar68));
              lVar83 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
                }
              }
              auVar122._8_8_ = 0;
              auVar122._0_8_ = *(ulong *)(uVar73 + lVar83 * 8);
              auVar109 = vpunpcklqdq_avx(auVar122,ZEXT416(*(uint *)(local_27c0 + lVar83 * 4)));
              uVar75 = uVar75 - 1 & uVar75;
              if (uVar75 == 0) {
                auVar144 = vpcmpgtd_avx(auVar123,auVar88);
                auVar118 = vpshufd_avx(auVar144,0xaa);
                auVar144 = vblendvps_avx(auVar123,auVar88,auVar118);
                auVar88 = vblendvps_avx(auVar88,auVar123,auVar118);
                auVar123 = vpcmpgtd_avx(auVar109,auVar144);
                auVar118 = vpshufd_avx(auVar123,0xaa);
                auVar123 = vblendvps_avx(auVar109,auVar144,auVar118);
                auVar109 = vblendvps_avx(auVar144,auVar109,auVar118);
                auVar144 = vpcmpgtd_avx(auVar109,auVar88);
                auVar118 = vpshufd_avx(auVar144,0xaa);
                auVar144 = vblendvps_avx(auVar109,auVar88,auVar118);
                auVar88 = vblendvps_avx(auVar88,auVar109,auVar118);
                *pauVar71 = auVar88;
                pauVar71[1] = auVar144;
                uVar79 = auVar123._0_8_;
                pauVar67 = pauVar71 + 2;
              }
              else {
                lVar83 = 0;
                if (uVar75 != 0) {
                  for (; (uVar75 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
                  }
                }
                auVar138._8_8_ = 0;
                auVar138._0_8_ = *(ulong *)(uVar73 + lVar83 * 8);
                auVar144 = vpunpcklqdq_avx(auVar138,ZEXT416(*(uint *)(local_27c0 + lVar83 * 4)));
                uVar75 = uVar75 - 1 & uVar75;
                uVar77 = (ulong)uVar75;
                if (uVar75 == 0) {
                  auVar118 = vpcmpgtd_avx(auVar123,auVar88);
                  auVar145 = vpshufd_avx(auVar118,0xaa);
                  auVar118 = vblendvps_avx(auVar123,auVar88,auVar145);
                  auVar88 = vblendvps_avx(auVar88,auVar123,auVar145);
                  auVar123 = vpcmpgtd_avx(auVar144,auVar109);
                  auVar145 = vpshufd_avx(auVar123,0xaa);
                  auVar123 = vblendvps_avx(auVar144,auVar109,auVar145);
                  auVar109 = vblendvps_avx(auVar109,auVar144,auVar145);
                  auVar144 = vpcmpgtd_avx(auVar109,auVar88);
                  auVar145 = vpshufd_avx(auVar144,0xaa);
                  auVar144 = vblendvps_avx(auVar109,auVar88,auVar145);
                  auVar88 = vblendvps_avx(auVar88,auVar109,auVar145);
                  auVar109 = vpcmpgtd_avx(auVar123,auVar118);
                  auVar145 = vpshufd_avx(auVar109,0xaa);
                  auVar109 = vblendvps_avx(auVar123,auVar118,auVar145);
                  auVar123 = vblendvps_avx(auVar118,auVar123,auVar145);
                  auVar118 = vpcmpgtd_avx(auVar144,auVar123);
                  auVar145 = vpshufd_avx(auVar118,0xaa);
                  auVar118 = vblendvps_avx(auVar144,auVar123,auVar145);
                  auVar123 = vblendvps_avx(auVar123,auVar144,auVar145);
                  *pauVar71 = auVar88;
                  pauVar71[1] = auVar123;
                  pauVar71[2] = auVar118;
                  uVar79 = auVar109._0_8_;
                  pauVar67 = pauVar71 + 3;
                }
                else {
                  *pauVar71 = auVar88;
                  pauVar71[1] = auVar123;
                  pauVar71[2] = auVar109;
                  pauVar71[3] = auVar144;
                  lVar83 = 0x30;
                  do {
                    lVar80 = lVar83;
                    lVar83 = 0;
                    if (uVar77 != 0) {
                      for (; (uVar77 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
                      }
                    }
                    uVar79 = *(ulong *)(uVar73 + lVar83 * 8);
                    auVar100._8_8_ = 0;
                    auVar100._0_8_ = uVar79;
                    auVar88 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_27c0 + lVar83 * 4)));
                    *(undefined1 (*) [16])(pauVar71[1] + lVar80) = auVar88;
                    uVar77 = uVar77 & uVar77 - 1;
                    lVar83 = lVar80 + 0x10;
                  } while (uVar77 != 0);
                  pauVar67 = (undefined1 (*) [16])(pauVar71[1] + lVar80);
                  if (lVar80 + 0x10 != 0) {
                    lVar83 = 0x10;
                    pauVar78 = pauVar71;
                    do {
                      auVar88 = pauVar78[1];
                      pauVar78 = pauVar78 + 1;
                      uVar75 = vextractps_avx(auVar88,2);
                      lVar80 = lVar83;
                      do {
                        if (uVar75 <= *(uint *)(pauVar71[-1] + lVar80 + 8)) {
                          pauVar81 = (undefined1 (*) [16])(*pauVar71 + lVar80);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar71 + lVar80) =
                             *(undefined1 (*) [16])(pauVar71[-1] + lVar80);
                        lVar80 = lVar80 + -0x10;
                        pauVar81 = pauVar71;
                      } while (lVar80 != 0);
                      *pauVar81 = auVar88;
                      lVar83 = lVar83 + 0x10;
                    } while (pauVar67 != pauVar78);
                    uVar79 = *(ulong *)*pauVar67;
                  }
                }
              }
            }
          }
        }
        local_2888 = (ulong)((uint)uVar79 & 0xf) - 8;
        if (local_2888 != 0) {
          uVar79 = uVar79 & 0xfffffffffffffff0;
          lVar83 = 0;
          do {
            lVar72 = lVar83 * 0x60;
            local_2880 = context->scene;
            ppfVar4 = (context->scene->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar79 + 0x40 + lVar72)];
            pfVar6 = ppfVar4[*(uint *)(uVar79 + 0x44 + lVar72)];
            pfVar7 = ppfVar4[*(uint *)(uVar79 + 0x48 + lVar72)];
            pfVar8 = ppfVar4[*(uint *)(uVar79 + 0x4c + lVar72)];
            auVar109 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar79 + lVar72)),
                                     *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar79 + 8 + lVar72))
                                    );
            auVar88 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar79 + lVar72)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar79 + 8 + lVar72)))
            ;
            auVar144 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar79 + 4 + lVar72))
                                     ,*(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar79 + 0xc + lVar72)));
            auVar123 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar79 + 4 + lVar72))
                                     ,*(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar79 + 0xc + lVar72)));
            auVar145 = vunpcklps_avx(auVar88,auVar123);
            auVar120 = vunpcklps_avx(auVar109,auVar144);
            auVar88 = vunpckhps_avx(auVar109,auVar144);
            auVar144 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar79 + 0x10 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar79 + 0x18 + lVar72)));
            auVar123 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar79 + 0x10 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar79 + 0x18 + lVar72)));
            auVar118 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar79 + 0x14 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar79 + 0x1c + lVar72)));
            auVar109 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar79 + 0x14 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar79 + 0x1c + lVar72)));
            auVar121 = vunpcklps_avx(auVar123,auVar109);
            auVar137 = vunpcklps_avx(auVar144,auVar118);
            auVar123 = vunpckhps_avx(auVar144,auVar118);
            auVar118 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar79 + 0x20 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar79 + 0x28 + lVar72)));
            auVar109 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar79 + 0x20 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar79 + 0x28 + lVar72)));
            auVar146 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar79 + 0x24 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar79 + 0x2c + lVar72)));
            auVar144 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar79 + 0x24 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar79 + 0x2c + lVar72)));
            auVar163 = vunpcklps_avx(auVar109,auVar144);
            auVar164 = vunpcklps_avx(auVar118,auVar146);
            auVar109 = vunpckhps_avx(auVar118,auVar146);
            auVar146 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar79 + 0x30 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar79 + 0x38 + lVar72)));
            auVar144 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar79 + 0x30 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar79 + 0x38 + lVar72)));
            auVar169 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar79 + 0x34 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar79 + 0x3c + lVar72)));
            auVar118 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar79 + 0x34 + lVar72)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar79 + 0x3c + lVar72)));
            auVar118 = vunpcklps_avx(auVar144,auVar118);
            auVar170 = vunpcklps_avx(auVar146,auVar169);
            lVar80 = uVar79 + 0x40 + lVar72;
            local_23c0 = *(undefined8 *)(lVar80 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar80 + 0x18);
            auVar144 = vunpckhps_avx(auVar146,auVar169);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar72 = uVar79 + 0x50 + lVar72;
            local_27e0 = *(undefined8 *)(lVar72 + 0x10);
            uStack_27d8 = *(undefined8 *)(lVar72 + 0x18);
            uStack_27d0 = local_27e0;
            uStack_27c8 = uStack_27d8;
            auVar149._16_16_ = auVar164;
            auVar149._0_16_ = auVar120;
            auVar173._16_16_ = auVar109;
            auVar173._0_16_ = auVar88;
            auVar242._16_16_ = auVar163;
            auVar242._0_16_ = auVar145;
            auVar167._16_16_ = auVar137;
            auVar167._0_16_ = auVar137;
            auVar208._16_16_ = auVar123;
            auVar208._0_16_ = auVar123;
            auVar112._16_16_ = auVar121;
            auVar112._0_16_ = auVar121;
            auVar215._16_16_ = auVar170;
            auVar215._0_16_ = auVar170;
            auVar185._16_16_ = auVar144;
            auVar185._0_16_ = auVar144;
            auVar126._16_16_ = auVar118;
            auVar126._0_16_ = auVar118;
            uVar2 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar222._4_4_ = uVar2;
            auVar222._0_4_ = uVar2;
            auVar222._8_4_ = uVar2;
            auVar222._12_4_ = uVar2;
            auVar222._16_4_ = uVar2;
            auVar222._20_4_ = uVar2;
            auVar222._24_4_ = uVar2;
            auVar222._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar237._4_4_ = uVar2;
            auVar237._0_4_ = uVar2;
            auVar237._8_4_ = uVar2;
            auVar237._12_4_ = uVar2;
            auVar237._16_4_ = uVar2;
            auVar237._20_4_ = uVar2;
            auVar237._24_4_ = uVar2;
            auVar237._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar239._4_4_ = uVar2;
            auVar239._0_4_ = uVar2;
            auVar239._8_4_ = uVar2;
            auVar239._12_4_ = uVar2;
            auVar239._16_4_ = uVar2;
            auVar239._20_4_ = uVar2;
            auVar239._24_4_ = uVar2;
            auVar239._28_4_ = uVar2;
            local_2820 = vsubps_avx(auVar149,auVar222);
            local_2800 = vsubps_avx(auVar173,auVar237);
            local_2400 = vsubps_avx(auVar242,auVar239);
            auVar124 = vsubps_avx(auVar167,auVar222);
            auVar23 = vsubps_avx(auVar208,auVar237);
            auVar27 = vsubps_avx(auVar112,auVar239);
            auVar28 = vsubps_avx(auVar215,auVar222);
            auVar29 = vsubps_avx(auVar185,auVar237);
            auVar30 = vsubps_avx(auVar126,auVar239);
            local_2420 = vsubps_avx(auVar28,local_2820);
            local_2440 = vsubps_avx(auVar29,local_2800);
            local_2460 = vsubps_avx(auVar30,local_2400);
            fVar24 = local_2800._0_4_;
            fVar142 = auVar29._0_4_ + fVar24;
            fVar10 = local_2800._4_4_;
            fVar150 = auVar29._4_4_ + fVar10;
            fVar113 = local_2800._8_4_;
            fVar152 = auVar29._8_4_ + fVar113;
            fVar116 = local_2800._12_4_;
            fVar154 = auVar29._12_4_ + fVar116;
            fVar14 = local_2800._16_4_;
            fVar156 = auVar29._16_4_ + fVar14;
            fVar17 = local_2800._20_4_;
            fVar158 = auVar29._20_4_ + fVar17;
            fVar20 = local_2800._24_4_;
            fVar160 = auVar29._24_4_ + fVar20;
            fVar98 = local_2800._28_4_;
            fVar25 = local_2400._0_4_;
            fVar175 = auVar30._0_4_ + fVar25;
            fVar11 = local_2400._4_4_;
            fVar186 = auVar30._4_4_ + fVar11;
            fVar114 = local_2400._8_4_;
            fVar189 = auVar30._8_4_ + fVar114;
            fVar117 = local_2400._12_4_;
            fVar192 = auVar30._12_4_ + fVar117;
            fVar15 = local_2400._16_4_;
            fVar195 = auVar30._16_4_ + fVar15;
            fVar18 = local_2400._20_4_;
            fVar198 = auVar30._20_4_ + fVar18;
            fVar21 = local_2400._24_4_;
            fVar201 = auVar30._24_4_ + fVar21;
            fVar205 = local_2400._28_4_;
            fVar87 = local_2460._0_4_;
            fVar92 = local_2460._4_4_;
            auVar32._4_4_ = fVar92 * fVar150;
            auVar32._0_4_ = fVar87 * fVar142;
            fVar93 = local_2460._8_4_;
            auVar32._8_4_ = fVar93 * fVar152;
            fVar94 = local_2460._12_4_;
            auVar32._12_4_ = fVar94 * fVar154;
            fVar95 = local_2460._16_4_;
            auVar32._16_4_ = fVar95 * fVar156;
            fVar96 = local_2460._20_4_;
            auVar32._20_4_ = fVar96 * fVar158;
            fVar97 = local_2460._24_4_;
            auVar32._24_4_ = fVar97 * fVar160;
            auVar32._28_4_ = auVar123._12_4_;
            fVar220 = local_2440._0_4_;
            fVar225 = local_2440._4_4_;
            auVar33._4_4_ = fVar225 * fVar186;
            auVar33._0_4_ = fVar220 * fVar175;
            fVar227 = local_2440._8_4_;
            auVar33._8_4_ = fVar227 * fVar189;
            fVar229 = local_2440._12_4_;
            auVar33._12_4_ = fVar229 * fVar192;
            fVar231 = local_2440._16_4_;
            auVar33._16_4_ = fVar231 * fVar195;
            fVar233 = local_2440._20_4_;
            auVar33._20_4_ = fVar233 * fVar198;
            fVar235 = local_2440._24_4_;
            auVar33._24_4_ = fVar235 * fVar201;
            auVar33._28_4_ = auVar170._12_4_;
            auVar31 = vsubps_avx(auVar33,auVar32);
            fVar26 = local_2820._0_4_;
            fVar204 = auVar28._0_4_ + fVar26;
            fVar12 = local_2820._4_4_;
            fVar209 = auVar28._4_4_ + fVar12;
            fVar115 = local_2820._8_4_;
            fVar210 = auVar28._8_4_ + fVar115;
            fVar13 = local_2820._12_4_;
            fVar211 = auVar28._12_4_ + fVar13;
            fVar16 = local_2820._16_4_;
            fVar212 = auVar28._16_4_ + fVar16;
            fVar19 = local_2820._20_4_;
            fVar213 = auVar28._20_4_ + fVar19;
            fVar22 = local_2820._24_4_;
            fVar214 = auVar28._24_4_ + fVar22;
            fVar107 = local_2420._0_4_;
            fVar108 = local_2420._4_4_;
            auVar34._4_4_ = fVar186 * fVar108;
            auVar34._0_4_ = fVar175 * fVar107;
            fVar175 = local_2420._8_4_;
            auVar34._8_4_ = fVar189 * fVar175;
            fVar186 = local_2420._12_4_;
            auVar34._12_4_ = fVar192 * fVar186;
            fVar189 = local_2420._16_4_;
            auVar34._16_4_ = fVar195 * fVar189;
            fVar192 = local_2420._20_4_;
            auVar34._20_4_ = fVar198 * fVar192;
            fVar195 = local_2420._24_4_;
            auVar34._24_4_ = fVar201 * fVar195;
            auVar34._28_4_ = auVar30._28_4_ + fVar205;
            auVar35._4_4_ = fVar209 * fVar92;
            auVar35._0_4_ = fVar204 * fVar87;
            auVar35._8_4_ = fVar210 * fVar93;
            auVar35._12_4_ = fVar211 * fVar94;
            auVar35._16_4_ = fVar212 * fVar95;
            auVar35._20_4_ = fVar213 * fVar96;
            auVar35._24_4_ = fVar214 * fVar97;
            auVar35._28_4_ = auVar170._12_4_;
            auVar101 = vsubps_avx(auVar35,auVar34);
            auVar36._4_4_ = fVar225 * fVar209;
            auVar36._0_4_ = fVar220 * fVar204;
            auVar36._8_4_ = fVar227 * fVar210;
            auVar36._12_4_ = fVar229 * fVar211;
            auVar36._16_4_ = fVar231 * fVar212;
            auVar36._20_4_ = fVar233 * fVar213;
            auVar36._24_4_ = fVar235 * fVar214;
            auVar36._28_4_ = auVar28._28_4_ + local_2820._28_4_;
            auVar37._4_4_ = fVar108 * fVar150;
            auVar37._0_4_ = fVar107 * fVar142;
            auVar37._8_4_ = fVar175 * fVar152;
            auVar37._12_4_ = fVar186 * fVar154;
            auVar37._16_4_ = fVar189 * fVar156;
            auVar37._20_4_ = fVar192 * fVar158;
            auVar37._24_4_ = fVar195 * fVar160;
            auVar37._28_4_ = auVar29._28_4_ + fVar98;
            auVar111 = vsubps_avx(auVar37,auVar36);
            local_28c0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar142 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_2940._4_4_ = fVar142;
            local_2940._0_4_ = fVar142;
            local_2940._8_4_ = fVar142;
            local_2940._12_4_ = fVar142;
            local_2940._16_4_ = fVar142;
            local_2940._20_4_ = fVar142;
            local_2940._24_4_ = fVar142;
            local_2940._28_4_ = fVar142;
            local_28e0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_24c0._0_4_ =
                 auVar31._0_4_ * (float)local_28e0._4_4_ +
                 (float)local_28c0._4_4_ * auVar101._0_4_ + fVar142 * auVar111._0_4_;
            local_24c0._4_4_ =
                 auVar31._4_4_ * (float)local_28e0._4_4_ +
                 (float)local_28c0._4_4_ * auVar101._4_4_ + fVar142 * auVar111._4_4_;
            local_24c0._8_4_ =
                 auVar31._8_4_ * (float)local_28e0._4_4_ +
                 (float)local_28c0._4_4_ * auVar101._8_4_ + fVar142 * auVar111._8_4_;
            local_24c0._12_4_ =
                 auVar31._12_4_ * (float)local_28e0._4_4_ +
                 (float)local_28c0._4_4_ * auVar101._12_4_ + fVar142 * auVar111._12_4_;
            local_24c0._16_4_ =
                 auVar31._16_4_ * (float)local_28e0._4_4_ +
                 (float)local_28c0._4_4_ * auVar101._16_4_ + fVar142 * auVar111._16_4_;
            local_24c0._20_4_ =
                 auVar31._20_4_ * (float)local_28e0._4_4_ +
                 (float)local_28c0._4_4_ * auVar101._20_4_ + fVar142 * auVar111._20_4_;
            local_24c0._24_4_ =
                 auVar31._24_4_ * (float)local_28e0._4_4_ +
                 (float)local_28c0._4_4_ * auVar101._24_4_ + fVar142 * auVar111._24_4_;
            local_24c0._28_4_ = auVar101._28_4_ + auVar101._28_4_ + auVar111._28_4_;
            auVar31 = vsubps_avx(local_2800,auVar23);
            local_24a0 = vsubps_avx(local_2400,auVar27);
            fVar209 = fVar24 + auVar23._0_4_;
            fVar210 = fVar10 + auVar23._4_4_;
            fVar211 = fVar113 + auVar23._8_4_;
            fVar212 = fVar116 + auVar23._12_4_;
            fVar213 = fVar14 + auVar23._16_4_;
            fVar214 = fVar17 + auVar23._20_4_;
            fVar161 = fVar20 + auVar23._24_4_;
            fVar150 = auVar23._28_4_;
            fVar154 = fVar25 + auVar27._0_4_;
            fVar156 = fVar11 + auVar27._4_4_;
            fVar158 = fVar114 + auVar27._8_4_;
            fVar160 = fVar117 + auVar27._12_4_;
            fVar198 = fVar15 + auVar27._16_4_;
            fVar201 = fVar18 + auVar27._20_4_;
            fVar204 = fVar21 + auVar27._24_4_;
            fVar152 = auVar27._28_4_;
            fVar221 = local_24a0._0_4_;
            fVar226 = local_24a0._4_4_;
            auVar38._4_4_ = fVar226 * fVar210;
            auVar38._0_4_ = fVar221 * fVar209;
            fVar228 = local_24a0._8_4_;
            auVar38._8_4_ = fVar228 * fVar211;
            fVar230 = local_24a0._12_4_;
            auVar38._12_4_ = fVar230 * fVar212;
            fVar232 = local_24a0._16_4_;
            auVar38._16_4_ = fVar232 * fVar213;
            fVar234 = local_24a0._20_4_;
            auVar38._20_4_ = fVar234 * fVar214;
            fVar236 = local_24a0._24_4_;
            auVar38._24_4_ = fVar236 * fVar161;
            auVar38._28_4_ = fVar205;
            fVar176 = auVar31._0_4_;
            fVar187 = auVar31._4_4_;
            auVar39._4_4_ = fVar187 * fVar156;
            auVar39._0_4_ = fVar176 * fVar154;
            fVar190 = auVar31._8_4_;
            auVar39._8_4_ = fVar190 * fVar158;
            fVar193 = auVar31._12_4_;
            auVar39._12_4_ = fVar193 * fVar160;
            fVar196 = auVar31._16_4_;
            auVar39._16_4_ = fVar196 * fVar198;
            fVar199 = auVar31._20_4_;
            auVar39._20_4_ = fVar199 * fVar201;
            fVar202 = auVar31._24_4_;
            auVar39._24_4_ = fVar202 * fVar204;
            auVar39._28_4_ = fVar98;
            auVar31 = vsubps_avx(auVar39,auVar38);
            auVar101 = vsubps_avx(local_2820,auVar124);
            fVar241 = auVar101._0_4_;
            fVar244 = auVar101._4_4_;
            auVar40._4_4_ = fVar244 * fVar156;
            auVar40._0_4_ = fVar241 * fVar154;
            fVar245 = auVar101._8_4_;
            auVar40._8_4_ = fVar245 * fVar158;
            fVar246 = auVar101._12_4_;
            auVar40._12_4_ = fVar246 * fVar160;
            fVar247 = auVar101._16_4_;
            auVar40._16_4_ = fVar247 * fVar198;
            fVar248 = auVar101._20_4_;
            auVar40._20_4_ = fVar248 * fVar201;
            fVar249 = auVar101._24_4_;
            auVar40._24_4_ = fVar249 * fVar204;
            auVar40._28_4_ = fVar205 + fVar152;
            fVar205 = auVar124._0_4_ + fVar26;
            fVar154 = auVar124._4_4_ + fVar12;
            fVar156 = auVar124._8_4_ + fVar115;
            fVar158 = auVar124._12_4_ + fVar13;
            fVar160 = auVar124._16_4_ + fVar16;
            fVar198 = auVar124._20_4_ + fVar19;
            fVar201 = auVar124._24_4_ + fVar22;
            auVar41._4_4_ = fVar226 * fVar154;
            auVar41._0_4_ = fVar221 * fVar205;
            auVar41._8_4_ = fVar228 * fVar156;
            auVar41._12_4_ = fVar230 * fVar158;
            auVar41._16_4_ = fVar232 * fVar160;
            auVar41._20_4_ = fVar234 * fVar198;
            auVar41._24_4_ = fVar236 * fVar201;
            auVar41._28_4_ = local_24a0._28_4_;
            auVar101 = vsubps_avx(auVar41,auVar40);
            auVar42._4_4_ = fVar187 * fVar154;
            auVar42._0_4_ = fVar176 * fVar205;
            auVar42._8_4_ = fVar190 * fVar156;
            auVar42._12_4_ = fVar193 * fVar158;
            auVar42._16_4_ = fVar196 * fVar160;
            auVar42._20_4_ = fVar199 * fVar198;
            auVar42._24_4_ = fVar202 * fVar201;
            auVar42._28_4_ = auVar124._28_4_ + local_2820._28_4_;
            auVar43._4_4_ = fVar244 * fVar210;
            auVar43._0_4_ = fVar241 * fVar209;
            auVar43._8_4_ = fVar245 * fVar211;
            auVar43._12_4_ = fVar246 * fVar212;
            auVar43._16_4_ = fVar247 * fVar213;
            auVar43._20_4_ = fVar248 * fVar214;
            auVar43._24_4_ = fVar249 * fVar161;
            auVar43._28_4_ = fVar98 + fVar150;
            auVar111 = vsubps_avx(auVar43,auVar42);
            local_24e0._0_4_ =
                 (float)local_28e0._4_4_ * auVar31._0_4_ +
                 (float)local_28c0._4_4_ * auVar101._0_4_ + fVar142 * auVar111._0_4_;
            local_24e0._4_4_ =
                 (float)local_28e0._4_4_ * auVar31._4_4_ +
                 (float)local_28c0._4_4_ * auVar101._4_4_ + fVar142 * auVar111._4_4_;
            local_24e0._8_4_ =
                 (float)local_28e0._4_4_ * auVar31._8_4_ +
                 (float)local_28c0._4_4_ * auVar101._8_4_ + fVar142 * auVar111._8_4_;
            local_24e0._12_4_ =
                 (float)local_28e0._4_4_ * auVar31._12_4_ +
                 (float)local_28c0._4_4_ * auVar101._12_4_ + fVar142 * auVar111._12_4_;
            local_24e0._16_4_ =
                 (float)local_28e0._4_4_ * auVar31._16_4_ +
                 (float)local_28c0._4_4_ * auVar101._16_4_ + fVar142 * auVar111._16_4_;
            local_24e0._20_4_ =
                 (float)local_28e0._4_4_ * auVar31._20_4_ +
                 (float)local_28c0._4_4_ * auVar101._20_4_ + fVar142 * auVar111._20_4_;
            local_24e0._24_4_ =
                 (float)local_28e0._4_4_ * auVar31._24_4_ +
                 (float)local_28c0._4_4_ * auVar101._24_4_ + fVar142 * auVar111._24_4_;
            local_24e0._28_4_ = auVar31._28_4_ + auVar101._28_4_ + auVar111._28_4_;
            local_2480 = vsubps_avx(auVar124,auVar28);
            fVar201 = auVar124._0_4_ + auVar28._0_4_;
            fVar204 = auVar124._4_4_ + auVar28._4_4_;
            fVar209 = auVar124._8_4_ + auVar28._8_4_;
            fVar210 = auVar124._12_4_ + auVar28._12_4_;
            fVar211 = auVar124._16_4_ + auVar28._16_4_;
            fVar212 = auVar124._20_4_ + auVar28._20_4_;
            fVar213 = auVar124._24_4_ + auVar28._24_4_;
            fVar214 = auVar124._28_4_ + auVar28._28_4_;
            auVar124 = vsubps_avx(auVar23,auVar29);
            fVar98 = auVar23._0_4_ + auVar29._0_4_;
            fVar205 = auVar23._4_4_ + auVar29._4_4_;
            fVar154 = auVar23._8_4_ + auVar29._8_4_;
            fVar156 = auVar23._12_4_ + auVar29._12_4_;
            fVar158 = auVar23._16_4_ + auVar29._16_4_;
            fVar160 = auVar23._20_4_ + auVar29._20_4_;
            fVar198 = auVar23._24_4_ + auVar29._24_4_;
            auVar23 = vsubps_avx(auVar27,auVar30);
            fVar161 = auVar27._0_4_ + auVar30._0_4_;
            fVar131 = auVar27._4_4_ + auVar30._4_4_;
            fVar132 = auVar27._8_4_ + auVar30._8_4_;
            fVar133 = auVar27._12_4_ + auVar30._12_4_;
            fVar134 = auVar27._16_4_ + auVar30._16_4_;
            fVar135 = auVar27._20_4_ + auVar30._20_4_;
            fVar136 = auVar27._24_4_ + auVar30._24_4_;
            fVar143 = auVar23._0_4_;
            fVar151 = auVar23._4_4_;
            auVar44._4_4_ = fVar151 * fVar205;
            auVar44._0_4_ = fVar143 * fVar98;
            fVar153 = auVar23._8_4_;
            auVar44._8_4_ = fVar153 * fVar154;
            fVar155 = auVar23._12_4_;
            auVar44._12_4_ = fVar155 * fVar156;
            fVar157 = auVar23._16_4_;
            auVar44._16_4_ = fVar157 * fVar158;
            fVar159 = auVar23._20_4_;
            auVar44._20_4_ = fVar159 * fVar160;
            fVar162 = auVar23._24_4_;
            auVar44._24_4_ = fVar162 * fVar198;
            auVar44._28_4_ = auVar31._28_4_;
            fVar177 = auVar124._0_4_;
            fVar188 = auVar124._4_4_;
            auVar45._4_4_ = fVar188 * fVar131;
            auVar45._0_4_ = fVar177 * fVar161;
            fVar191 = auVar124._8_4_;
            auVar45._8_4_ = fVar191 * fVar132;
            fVar194 = auVar124._12_4_;
            auVar45._12_4_ = fVar194 * fVar133;
            fVar197 = auVar124._16_4_;
            auVar45._16_4_ = fVar197 * fVar134;
            fVar200 = auVar124._20_4_;
            auVar45._20_4_ = fVar200 * fVar135;
            fVar203 = auVar124._24_4_;
            auVar45._24_4_ = fVar203 * fVar136;
            auVar45._28_4_ = fVar150;
            auVar124 = vsubps_avx(auVar45,auVar44);
            fVar217 = local_2480._0_4_;
            fVar219 = local_2480._4_4_;
            auVar46._4_4_ = fVar219 * fVar131;
            auVar46._0_4_ = fVar217 * fVar161;
            fVar161 = local_2480._8_4_;
            auVar46._8_4_ = fVar161 * fVar132;
            fVar131 = local_2480._12_4_;
            auVar46._12_4_ = fVar131 * fVar133;
            fVar132 = local_2480._16_4_;
            auVar46._16_4_ = fVar132 * fVar134;
            fVar133 = local_2480._20_4_;
            auVar46._20_4_ = fVar133 * fVar135;
            fVar134 = local_2480._24_4_;
            auVar46._24_4_ = fVar134 * fVar136;
            auVar46._28_4_ = fVar152 + auVar30._28_4_;
            auVar47._4_4_ = fVar151 * fVar204;
            auVar47._0_4_ = fVar143 * fVar201;
            auVar47._8_4_ = fVar153 * fVar209;
            auVar47._12_4_ = fVar155 * fVar210;
            auVar47._16_4_ = fVar157 * fVar211;
            auVar47._20_4_ = fVar159 * fVar212;
            auVar47._24_4_ = fVar162 * fVar213;
            auVar47._28_4_ = fVar150;
            auVar23 = vsubps_avx(auVar47,auVar46);
            auVar48._4_4_ = fVar188 * fVar204;
            auVar48._0_4_ = fVar177 * fVar201;
            auVar48._8_4_ = fVar191 * fVar209;
            auVar48._12_4_ = fVar194 * fVar210;
            auVar48._16_4_ = fVar197 * fVar211;
            auVar48._20_4_ = fVar200 * fVar212;
            auVar48._24_4_ = fVar203 * fVar213;
            auVar48._28_4_ = fVar214;
            auVar28 = local_2480;
            auVar49._4_4_ = fVar219 * fVar205;
            auVar49._0_4_ = fVar217 * fVar98;
            auVar49._8_4_ = fVar161 * fVar154;
            auVar49._12_4_ = fVar131 * fVar156;
            auVar49._16_4_ = fVar132 * fVar158;
            auVar49._20_4_ = fVar133 * fVar160;
            auVar49._24_4_ = fVar134 * fVar198;
            auVar49._28_4_ = fVar150 + auVar29._28_4_;
            auVar27 = vsubps_avx(auVar49,auVar48);
            local_28c0._0_4_ = local_28c0._4_4_;
            fStack_28b8 = (float)local_28c0._4_4_;
            fStack_28b4 = (float)local_28c0._4_4_;
            fStack_28b0 = (float)local_28c0._4_4_;
            fStack_28ac = (float)local_28c0._4_4_;
            fStack_28a8 = (float)local_28c0._4_4_;
            fStack_28a4 = (float)local_28c0._4_4_;
            local_28e0._0_4_ = local_28e0._4_4_;
            fStack_28d8 = (float)local_28e0._4_4_;
            fStack_28d4 = (float)local_28e0._4_4_;
            fStack_28d0 = (float)local_28e0._4_4_;
            fStack_28cc = (float)local_28e0._4_4_;
            fStack_28c8 = (float)local_28e0._4_4_;
            fStack_28c4 = (float)local_28e0._4_4_;
            auVar102._0_4_ =
                 (float)local_28e0._4_4_ * auVar124._0_4_ +
                 (float)local_28c0._4_4_ * auVar23._0_4_ + fVar142 * auVar27._0_4_;
            auVar102._4_4_ =
                 (float)local_28e0._4_4_ * auVar124._4_4_ +
                 (float)local_28c0._4_4_ * auVar23._4_4_ + fVar142 * auVar27._4_4_;
            auVar102._8_4_ =
                 (float)local_28e0._4_4_ * auVar124._8_4_ +
                 (float)local_28c0._4_4_ * auVar23._8_4_ + fVar142 * auVar27._8_4_;
            auVar102._12_4_ =
                 (float)local_28e0._4_4_ * auVar124._12_4_ +
                 (float)local_28c0._4_4_ * auVar23._12_4_ + fVar142 * auVar27._12_4_;
            auVar102._16_4_ =
                 (float)local_28e0._4_4_ * auVar124._16_4_ +
                 (float)local_28c0._4_4_ * auVar23._16_4_ + fVar142 * auVar27._16_4_;
            auVar102._20_4_ =
                 (float)local_28e0._4_4_ * auVar124._20_4_ +
                 (float)local_28c0._4_4_ * auVar23._20_4_ + fVar142 * auVar27._20_4_;
            auVar102._24_4_ =
                 (float)local_28e0._4_4_ * auVar124._24_4_ +
                 (float)local_28c0._4_4_ * auVar23._24_4_ + fVar142 * auVar27._24_4_;
            auVar102._28_4_ = fVar214 + fVar214 + auVar27._28_4_;
            local_2520._0_4_ = auVar102._0_4_ + local_24c0._0_4_ + local_24e0._0_4_;
            local_2520._4_4_ = auVar102._4_4_ + local_24c0._4_4_ + local_24e0._4_4_;
            local_2520._8_4_ = auVar102._8_4_ + local_24c0._8_4_ + local_24e0._8_4_;
            local_2520._12_4_ = auVar102._12_4_ + local_24c0._12_4_ + local_24e0._12_4_;
            local_2520._16_4_ = auVar102._16_4_ + local_24c0._16_4_ + local_24e0._16_4_;
            local_2520._20_4_ = auVar102._20_4_ + local_24c0._20_4_ + local_24e0._20_4_;
            local_2520._24_4_ = auVar102._24_4_ + local_24c0._24_4_ + local_24e0._24_4_;
            local_2520._28_4_ = auVar102._28_4_ + local_24c0._28_4_ + local_24e0._28_4_;
            auVar124 = vminps_avx(local_24c0,local_24e0);
            auVar124 = vminps_avx(auVar124,auVar102);
            auVar127._8_4_ = 0x7fffffff;
            auVar127._0_8_ = 0x7fffffff7fffffff;
            auVar127._12_4_ = 0x7fffffff;
            auVar127._16_4_ = 0x7fffffff;
            auVar127._20_4_ = 0x7fffffff;
            auVar127._24_4_ = 0x7fffffff;
            auVar127._28_4_ = 0x7fffffff;
            local_2500 = vandps_avx(local_2520,auVar127);
            fVar98 = local_2500._0_4_ * 1.1920929e-07;
            fVar205 = local_2500._4_4_ * 1.1920929e-07;
            auVar50._4_4_ = fVar205;
            auVar50._0_4_ = fVar98;
            fVar150 = local_2500._8_4_ * 1.1920929e-07;
            auVar50._8_4_ = fVar150;
            fVar154 = local_2500._12_4_ * 1.1920929e-07;
            auVar50._12_4_ = fVar154;
            fVar156 = local_2500._16_4_ * 1.1920929e-07;
            auVar50._16_4_ = fVar156;
            fVar158 = local_2500._20_4_ * 1.1920929e-07;
            auVar50._20_4_ = fVar158;
            fVar160 = local_2500._24_4_ * 1.1920929e-07;
            auVar50._24_4_ = fVar160;
            auVar50._28_4_ = 0x34000000;
            auVar140._0_8_ = CONCAT44(fVar205,fVar98) ^ 0x8000000080000000;
            auVar140._8_4_ = -fVar150;
            auVar140._12_4_ = -fVar154;
            auVar140._16_4_ = -fVar156;
            auVar140._20_4_ = -fVar158;
            auVar140._24_4_ = -fVar160;
            auVar140._28_4_ = 0xb4000000;
            auVar124 = vcmpps_avx(auVar124,auVar140,5);
            auVar27 = vmaxps_avx(local_24c0,local_24e0);
            auVar23 = vmaxps_avx(auVar27,auVar102);
            auVar23 = vcmpps_avx(auVar23,auVar50,2);
            auVar23 = vorps_avx(auVar124,auVar23);
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0x7f,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0xbf,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar23[0x1f] < '\0') {
              auVar51._4_4_ = fVar187 * fVar92;
              auVar51._0_4_ = fVar176 * fVar87;
              auVar51._8_4_ = fVar190 * fVar93;
              auVar51._12_4_ = fVar193 * fVar94;
              auVar51._16_4_ = fVar196 * fVar95;
              auVar51._20_4_ = fVar199 * fVar96;
              auVar51._24_4_ = fVar202 * fVar97;
              auVar51._28_4_ = auVar124._28_4_;
              auVar52._4_4_ = fVar225 * fVar226;
              auVar52._0_4_ = fVar220 * fVar221;
              auVar52._8_4_ = fVar227 * fVar228;
              auVar52._12_4_ = fVar229 * fVar230;
              auVar52._16_4_ = fVar231 * fVar232;
              auVar52._20_4_ = fVar233 * fVar234;
              auVar52._24_4_ = fVar235 * fVar236;
              auVar52._28_4_ = 0x34000000;
              auVar29 = vsubps_avx(auVar52,auVar51);
              auVar53._4_4_ = fVar188 * fVar226;
              auVar53._0_4_ = fVar177 * fVar221;
              auVar53._8_4_ = fVar191 * fVar228;
              auVar53._12_4_ = fVar194 * fVar230;
              auVar53._16_4_ = fVar197 * fVar232;
              auVar53._20_4_ = fVar200 * fVar234;
              auVar53._24_4_ = fVar203 * fVar236;
              auVar53._28_4_ = auVar27._28_4_;
              auVar54._4_4_ = fVar187 * fVar151;
              auVar54._0_4_ = fVar176 * fVar143;
              auVar54._8_4_ = fVar190 * fVar153;
              auVar54._12_4_ = fVar193 * fVar155;
              auVar54._16_4_ = fVar196 * fVar157;
              auVar54._20_4_ = fVar199 * fVar159;
              auVar54._24_4_ = fVar202 * fVar162;
              auVar54._28_4_ = local_24e0._28_4_;
              auVar30 = vsubps_avx(auVar54,auVar53);
              auVar223._8_4_ = 0x7fffffff;
              auVar223._0_8_ = 0x7fffffff7fffffff;
              auVar223._12_4_ = 0x7fffffff;
              auVar223._16_4_ = 0x7fffffff;
              auVar223._20_4_ = 0x7fffffff;
              auVar223._24_4_ = 0x7fffffff;
              auVar223._28_4_ = 0x7fffffff;
              auVar124 = vandps_avx(auVar223,auVar51);
              auVar27 = vandps_avx(auVar223,auVar53);
              auVar124 = vcmpps_avx(auVar124,auVar27,1);
              local_2760 = vblendvps_avx(auVar30,auVar29,auVar124);
              auVar55._4_4_ = fVar244 * fVar151;
              auVar55._0_4_ = fVar241 * fVar143;
              auVar55._8_4_ = fVar245 * fVar153;
              auVar55._12_4_ = fVar246 * fVar155;
              auVar55._16_4_ = fVar247 * fVar157;
              auVar55._20_4_ = fVar248 * fVar159;
              auVar55._24_4_ = fVar249 * fVar162;
              auVar55._28_4_ = auVar124._28_4_;
              auVar56._4_4_ = fVar244 * fVar92;
              auVar56._0_4_ = fVar241 * fVar87;
              auVar56._8_4_ = fVar245 * fVar93;
              auVar56._12_4_ = fVar246 * fVar94;
              auVar56._16_4_ = fVar247 * fVar95;
              auVar56._20_4_ = fVar248 * fVar96;
              auVar56._24_4_ = fVar249 * fVar97;
              auVar56._28_4_ = auVar29._28_4_;
              auVar57._4_4_ = fVar108 * fVar226;
              auVar57._0_4_ = fVar107 * fVar221;
              auVar57._8_4_ = fVar175 * fVar228;
              auVar57._12_4_ = fVar186 * fVar230;
              auVar57._16_4_ = fVar189 * fVar232;
              auVar57._20_4_ = fVar192 * fVar234;
              auVar57._24_4_ = fVar195 * fVar236;
              auVar57._28_4_ = auVar27._28_4_;
              auVar29 = vsubps_avx(auVar56,auVar57);
              auVar58._4_4_ = fVar226 * fVar219;
              auVar58._0_4_ = fVar221 * fVar217;
              auVar58._8_4_ = fVar228 * fVar161;
              auVar58._12_4_ = fVar230 * fVar131;
              auVar58._16_4_ = fVar232 * fVar132;
              auVar58._20_4_ = fVar234 * fVar133;
              auVar58._24_4_ = fVar236 * fVar134;
              auVar58._28_4_ = local_24a0._28_4_;
              auVar30 = vsubps_avx(auVar58,auVar55);
              auVar124 = vandps_avx(auVar223,auVar57);
              auVar27 = vandps_avx(auVar223,auVar55);
              auVar27 = vcmpps_avx(auVar124,auVar27,1);
              local_2740 = vblendvps_avx(auVar30,auVar29,auVar27);
              auVar59._4_4_ = fVar187 * fVar219;
              auVar59._0_4_ = fVar176 * fVar217;
              auVar59._8_4_ = fVar190 * fVar161;
              auVar59._12_4_ = fVar193 * fVar131;
              auVar59._16_4_ = fVar196 * fVar132;
              auVar59._20_4_ = fVar199 * fVar133;
              auVar59._24_4_ = fVar202 * fVar134;
              auVar59._28_4_ = auVar27._28_4_;
              auVar60._4_4_ = fVar108 * fVar187;
              auVar60._0_4_ = fVar107 * fVar176;
              auVar60._8_4_ = fVar175 * fVar190;
              auVar60._12_4_ = fVar186 * fVar193;
              auVar60._16_4_ = fVar189 * fVar196;
              auVar60._20_4_ = fVar192 * fVar199;
              auVar60._24_4_ = fVar195 * fVar202;
              auVar60._28_4_ = auVar29._28_4_;
              auVar61._4_4_ = fVar225 * fVar244;
              auVar61._0_4_ = fVar220 * fVar241;
              auVar61._8_4_ = fVar227 * fVar245;
              auVar61._12_4_ = fVar229 * fVar246;
              auVar61._16_4_ = fVar231 * fVar247;
              auVar61._20_4_ = fVar233 * fVar248;
              auVar61._24_4_ = fVar235 * fVar249;
              auVar61._28_4_ = auVar124._28_4_;
              auVar62._4_4_ = fVar244 * fVar188;
              auVar62._0_4_ = fVar241 * fVar177;
              auVar62._8_4_ = fVar245 * fVar191;
              auVar62._12_4_ = fVar246 * fVar194;
              auVar62._16_4_ = fVar247 * fVar197;
              auVar62._20_4_ = fVar248 * fVar200;
              auVar62._24_4_ = fVar249 * fVar203;
              auVar62._28_4_ = local_2480._28_4_;
              auVar29 = vsubps_avx(auVar60,auVar61);
              auVar30 = vsubps_avx(auVar62,auVar59);
              auVar124 = vandps_avx(auVar61,auVar223);
              auVar27 = vandps_avx(auVar59,auVar223);
              auVar124 = vcmpps_avx(auVar124,auVar27,1);
              local_2720 = vblendvps_avx(auVar30,auVar29,auVar124);
              auVar88 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
              fVar189 = local_2720._0_4_;
              fVar192 = local_2720._4_4_;
              fVar195 = local_2720._8_4_;
              fVar87 = local_2720._12_4_;
              fVar92 = local_2720._16_4_;
              fVar93 = local_2720._20_4_;
              fVar94 = local_2720._24_4_;
              fVar198 = local_2740._0_4_;
              fVar201 = local_2740._4_4_;
              fVar204 = local_2740._8_4_;
              fVar209 = local_2740._12_4_;
              fVar210 = local_2740._16_4_;
              fVar211 = local_2740._20_4_;
              fVar212 = local_2740._24_4_;
              fVar95 = local_2760._0_4_;
              fVar96 = local_2760._4_4_;
              fVar97 = local_2760._8_4_;
              fVar154 = local_2760._12_4_;
              fVar156 = local_2760._16_4_;
              fVar158 = local_2760._20_4_;
              fVar160 = local_2760._24_4_;
              fVar98 = fVar95 * (float)local_28e0._4_4_ +
                       fVar198 * (float)local_28c0._4_4_ + fVar189 * fVar142;
              fVar205 = fVar96 * (float)local_28e0._4_4_ +
                        fVar201 * (float)local_28c0._4_4_ + fVar192 * fVar142;
              fVar150 = fVar97 * (float)local_28e0._4_4_ +
                        fVar204 * (float)local_28c0._4_4_ + fVar195 * fVar142;
              fVar107 = fVar154 * (float)local_28e0._4_4_ +
                        fVar209 * (float)local_28c0._4_4_ + fVar87 * fVar142;
              fVar108 = fVar156 * (float)local_28e0._4_4_ +
                        fVar210 * (float)local_28c0._4_4_ + fVar92 * fVar142;
              fVar175 = fVar158 * (float)local_28e0._4_4_ +
                        fVar211 * (float)local_28c0._4_4_ + fVar93 * fVar142;
              fVar142 = fVar160 * (float)local_28e0._4_4_ +
                        fVar212 * (float)local_28c0._4_4_ + fVar94 * fVar142;
              fVar186 = auVar124._28_4_ + auVar124._28_4_ + auVar23._28_4_;
              auVar103._0_4_ = fVar98 + fVar98;
              auVar103._4_4_ = fVar205 + fVar205;
              auVar103._8_4_ = fVar150 + fVar150;
              auVar103._12_4_ = fVar107 + fVar107;
              auVar103._16_4_ = fVar108 + fVar108;
              auVar103._20_4_ = fVar175 + fVar175;
              auVar103._24_4_ = fVar142 + fVar142;
              auVar103._28_4_ = fVar186 + fVar186;
              auVar124 = vrcpps_avx(auVar103);
              fVar98 = fVar95 * fVar26 + fVar198 * fVar24 + fVar189 * fVar25;
              fVar205 = fVar96 * fVar12 + fVar201 * fVar10 + fVar192 * fVar11;
              fVar113 = fVar97 * fVar115 + fVar204 * fVar113 + fVar195 * fVar114;
              fVar114 = fVar154 * fVar13 + fVar209 * fVar116 + fVar87 * fVar117;
              fVar115 = fVar156 * fVar16 + fVar210 * fVar14 + fVar92 * fVar15;
              fVar116 = fVar158 * fVar19 + fVar211 * fVar17 + fVar93 * fVar18;
              fVar117 = fVar160 * fVar22 + fVar212 * fVar20 + fVar94 * fVar21;
              fVar142 = auVar124._0_4_;
              fVar24 = auVar124._4_4_;
              auVar63._4_4_ = auVar103._4_4_ * fVar24;
              auVar63._0_4_ = auVar103._0_4_ * fVar142;
              fVar25 = auVar124._8_4_;
              auVar63._8_4_ = auVar103._8_4_ * fVar25;
              fVar26 = auVar124._12_4_;
              auVar63._12_4_ = auVar103._12_4_ * fVar26;
              fVar10 = auVar124._16_4_;
              auVar63._16_4_ = auVar103._16_4_ * fVar10;
              fVar11 = auVar124._20_4_;
              auVar63._20_4_ = auVar103._20_4_ * fVar11;
              fVar12 = auVar124._24_4_;
              auVar63._24_4_ = auVar103._24_4_ * fVar12;
              auVar63._28_4_ = auVar29._28_4_;
              auVar168._8_4_ = 0x3f800000;
              auVar168._0_8_ = 0x3f8000003f800000;
              auVar168._12_4_ = 0x3f800000;
              auVar168._16_4_ = 0x3f800000;
              auVar168._20_4_ = 0x3f800000;
              auVar168._24_4_ = 0x3f800000;
              auVar168._28_4_ = 0x3f800000;
              auVar124 = vsubps_avx(auVar168,auVar63);
              uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar141._4_4_ = uVar2;
              auVar141._0_4_ = uVar2;
              auVar141._8_4_ = uVar2;
              auVar141._12_4_ = uVar2;
              auVar141._16_4_ = uVar2;
              auVar141._20_4_ = uVar2;
              auVar141._24_4_ = uVar2;
              auVar141._28_4_ = uVar2;
              local_28c0._4_4_ = (fVar205 + fVar205) * (fVar24 + fVar24 * auVar124._4_4_);
              local_28c0._0_4_ = (fVar98 + fVar98) * (fVar142 + fVar142 * auVar124._0_4_);
              fStack_28b8 = (fVar113 + fVar113) * (fVar25 + fVar25 * auVar124._8_4_);
              fStack_28b4 = (fVar114 + fVar114) * (fVar26 + fVar26 * auVar124._12_4_);
              fStack_28b0 = (fVar115 + fVar115) * (fVar10 + fVar10 * auVar124._16_4_);
              fStack_28ac = (fVar116 + fVar116) * (fVar11 + fVar11 * auVar124._20_4_);
              fStack_28a8 = (fVar117 + fVar117) * (fVar12 + fVar12 * auVar124._24_4_);
              fStack_28a4 = fVar152;
              auVar124 = vcmpps_avx(auVar141,_local_28c0,2);
              fVar142 = (ray->super_RayK<1>).tfar;
              auVar128._4_4_ = fVar142;
              auVar128._0_4_ = fVar142;
              auVar128._8_4_ = fVar142;
              auVar128._12_4_ = fVar142;
              auVar128._16_4_ = fVar142;
              auVar128._20_4_ = fVar142;
              auVar128._24_4_ = fVar142;
              auVar128._28_4_ = fVar142;
              auVar23 = vcmpps_avx(_local_28c0,auVar128,2);
              auVar124 = vandps_avx(auVar23,auVar124);
              auVar27 = vcmpps_avx(auVar103,_DAT_01faff00,4);
              auVar124 = vandps_avx(auVar124,auVar27);
              auVar123 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
              auVar88 = vpand_avx(auVar123,auVar88);
              auVar123 = vpmovsxwd_avx(auVar88);
              auVar109 = vpshufd_avx(auVar88,0xee);
              auVar109 = vpmovsxwd_avx(auVar109);
              local_2700._16_16_ = auVar109;
              local_2700._0_16_ = auVar123;
              if ((((((((local_2700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_2700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_2700 >> 0x7f,0) != '\0') ||
                    (local_2700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar109 >> 0x3f,0) != '\0') ||
                  (local_2700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar109[0xf] < '\0') {
                local_27c0 = local_24c0;
                local_27a0 = local_24e0;
                auVar124 = vrcpps_avx(local_2520);
                local_2780 = local_2520;
                fVar142 = auVar124._0_4_;
                fVar24 = auVar124._4_4_;
                auVar64._4_4_ = local_2520._4_4_ * fVar24;
                auVar64._0_4_ = local_2520._0_4_ * fVar142;
                fVar25 = auVar124._8_4_;
                auVar64._8_4_ = local_2520._8_4_ * fVar25;
                fVar26 = auVar124._12_4_;
                auVar64._12_4_ = local_2520._12_4_ * fVar26;
                fVar10 = auVar124._16_4_;
                auVar64._16_4_ = local_2520._16_4_ * fVar10;
                fVar11 = auVar124._20_4_;
                auVar64._20_4_ = local_2520._20_4_ * fVar11;
                fVar12 = auVar124._24_4_;
                auVar64._24_4_ = local_2520._24_4_ * fVar12;
                auVar64._28_4_ = auVar23._28_4_;
                auVar174._8_4_ = 0x3f800000;
                auVar174._0_8_ = 0x3f8000003f800000;
                auVar174._12_4_ = 0x3f800000;
                auVar174._16_4_ = 0x3f800000;
                auVar174._20_4_ = 0x3f800000;
                auVar174._24_4_ = 0x3f800000;
                auVar174._28_4_ = 0x3f800000;
                auVar23 = vsubps_avx(auVar174,auVar64);
                auVar104._0_4_ = fVar142 + fVar142 * auVar23._0_4_;
                auVar104._4_4_ = fVar24 + fVar24 * auVar23._4_4_;
                auVar104._8_4_ = fVar25 + fVar25 * auVar23._8_4_;
                auVar104._12_4_ = fVar26 + fVar26 * auVar23._12_4_;
                auVar104._16_4_ = fVar10 + fVar10 * auVar23._16_4_;
                auVar104._20_4_ = fVar11 + fVar11 * auVar23._20_4_;
                auVar104._24_4_ = fVar12 + fVar12 * auVar23._24_4_;
                auVar104._28_4_ = auVar124._28_4_ + auVar23._28_4_;
                auVar129._8_4_ = 0x219392ef;
                auVar129._0_8_ = 0x219392ef219392ef;
                auVar129._12_4_ = 0x219392ef;
                auVar129._16_4_ = 0x219392ef;
                auVar129._20_4_ = 0x219392ef;
                auVar129._24_4_ = 0x219392ef;
                auVar129._28_4_ = 0x219392ef;
                auVar23 = vcmpps_avx(local_2500,auVar129,5);
                auVar124 = vandps_avx(auVar23,auVar104);
                local_26a0 = _local_28c0;
                local_2620._8_8_ = uStack_2538;
                local_2620._0_8_ = local_2540;
                local_2620._16_8_ = uStack_2530;
                local_2620._24_8_ = uStack_2528;
                auVar65._4_4_ = local_24c0._4_4_ * auVar124._4_4_;
                auVar65._0_4_ = local_24c0._0_4_ * auVar124._0_4_;
                auVar65._8_4_ = local_24c0._8_4_ * auVar124._8_4_;
                auVar65._12_4_ = local_24c0._12_4_ * auVar124._12_4_;
                auVar65._16_4_ = local_24c0._16_4_ * auVar124._16_4_;
                auVar65._20_4_ = local_24c0._20_4_ * auVar124._20_4_;
                auVar65._24_4_ = local_24c0._24_4_ * auVar124._24_4_;
                auVar65._28_4_ = auVar23._28_4_;
                auVar23 = vminps_avx(auVar65,auVar174);
                auVar66._4_4_ = local_24e0._4_4_ * auVar124._4_4_;
                auVar66._0_4_ = local_24e0._0_4_ * auVar124._0_4_;
                auVar66._8_4_ = local_24e0._8_4_ * auVar124._8_4_;
                auVar66._12_4_ = local_24e0._12_4_ * auVar124._12_4_;
                auVar66._16_4_ = local_24e0._16_4_ * auVar124._16_4_;
                auVar66._20_4_ = local_24e0._20_4_ * auVar124._20_4_;
                auVar66._24_4_ = local_24e0._24_4_ * auVar124._24_4_;
                auVar66._28_4_ = auVar124._28_4_;
                auVar124 = vminps_avx(auVar66,auVar174);
                auVar27 = vsubps_avx(auVar174,auVar23);
                local_26c0 = vblendvps_avx(auVar124,auVar27,local_2620);
                auVar124 = vsubps_avx(auVar174,auVar124);
                local_26e0 = vblendvps_avx(auVar23,auVar124,local_2620);
                auVar105._8_4_ = 0xbf800000;
                auVar105._0_8_ = 0xbf800000bf800000;
                auVar105._12_4_ = 0xbf800000;
                auVar105._16_4_ = 0xbf800000;
                auVar105._20_4_ = 0xbf800000;
                auVar105._24_4_ = 0xbf800000;
                auVar105._28_4_ = 0xbf800000;
                auVar124 = vblendvps_avx(auVar174,auVar105,local_2620);
                fVar142 = auVar124._0_4_;
                fVar24 = auVar124._4_4_;
                fVar25 = auVar124._8_4_;
                fVar26 = auVar124._12_4_;
                fVar10 = auVar124._16_4_;
                fVar11 = auVar124._20_4_;
                fVar12 = auVar124._24_4_;
                local_2680[0] = fVar95 * fVar142;
                local_2680[1] = fVar96 * fVar24;
                local_2680[2] = fVar97 * fVar25;
                local_2680[3] = fVar154 * fVar26;
                fStack_2670 = fVar156 * fVar10;
                fStack_266c = fVar158 * fVar11;
                fStack_2668 = fVar160 * fVar12;
                uStack_2664 = auVar23._28_4_;
                local_2660[0] = fVar198 * fVar142;
                local_2660[1] = fVar201 * fVar24;
                local_2660[2] = fVar204 * fVar25;
                local_2660[3] = fVar209 * fVar26;
                fStack_2650 = fVar210 * fVar10;
                fStack_264c = fVar211 * fVar11;
                fStack_2648 = fVar212 * fVar12;
                uStack_2644 = local_26c0._28_4_;
                local_2640[0] = fVar142 * fVar189;
                local_2640[1] = fVar24 * fVar192;
                local_2640[2] = fVar25 * fVar195;
                local_2640[3] = fVar26 * fVar87;
                fStack_2630 = fVar10 * fVar92;
                fStack_262c = fVar11 * fVar93;
                fStack_2628 = fVar12 * fVar94;
                uStack_2624 = auVar124._28_4_;
                auVar123 = vpmovzxwd_avx(auVar88);
                auVar106._0_16_ = vpslld_avx(auVar123,0x1f);
                auVar123 = vpunpckhwd_avx(auVar88,auVar88);
                auVar123 = vpslld_avx(auVar123,0x1f);
                auVar106._16_16_ = auVar123;
                auVar130._8_4_ = 0x7f800000;
                auVar130._0_8_ = 0x7f8000007f800000;
                auVar130._12_4_ = 0x7f800000;
                auVar130._16_4_ = 0x7f800000;
                auVar130._20_4_ = 0x7f800000;
                auVar130._24_4_ = 0x7f800000;
                auVar130._28_4_ = 0x7f800000;
                auVar124 = vblendvps_avx(auVar130,_local_28c0,auVar106);
                auVar23 = vshufps_avx(auVar124,auVar124,0xb1);
                auVar23 = vminps_avx(auVar124,auVar23);
                auVar27 = vshufpd_avx(auVar23,auVar23,5);
                auVar23 = vminps_avx(auVar23,auVar27);
                auVar27 = vperm2f128_avx(auVar23,auVar23,1);
                auVar23 = vminps_avx(auVar23,auVar27);
                auVar124 = vcmpps_avx(auVar124,auVar23,0);
                auVar123 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
                auVar88 = vpand_avx(auVar123,auVar88);
                auVar123 = vpmovzxwd_avx(auVar88);
                auVar123 = vpslld_avx(auVar123,0x1f);
                auVar123 = vpsrad_avx(auVar123,0x1f);
                auVar88 = vpunpckhwd_avx(auVar88,auVar88);
                auVar88 = vpslld_avx(auVar88,0x1f);
                auVar88 = vpsrad_avx(auVar88,0x1f);
                auVar89._16_16_ = auVar88;
                auVar89._0_16_ = auVar123;
                _local_28e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                local_2840 = local_2700;
                if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar89 >> 0x7f,0) == '\0') &&
                      (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar88 >> 0x3f,0) == '\0') &&
                    (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar88[0xf]) {
                  auVar89 = local_2700;
                }
                uVar75 = vextractps_avx(local_28e0._0_16_,1);
                uVar68 = vmovmskps_avx(auVar89);
                uVar69 = 0;
                local_2480 = auVar28;
                if (uVar68 != 0) {
                  for (; (uVar68 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
                  }
                }
                do {
                  uVar73 = CONCAT44(0,uVar69);
                  uVar69 = *(uint *)((long)&local_23c0 + uVar73 * 4);
                  pGVar9 = (local_2880->geometries).items[uVar69].ptr;
                  if ((pGVar9->mask & uVar75) == 0) {
                    *(undefined4 *)(local_2840 + uVar73 * 4) = 0;
                  }
                  else {
                    if (context->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar74 = context->user;
                      if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar142 = *(float *)(local_26e0 + uVar73 * 4);
                        fVar24 = *(float *)(local_26c0 + uVar73 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_26a0 + uVar73 * 4);
                        (ray->Ng).field_0.field_0.x = local_2680[uVar73];
                        (ray->Ng).field_0.field_0.y = local_2660[uVar73];
                        (ray->Ng).field_0.field_0.z = local_2640[uVar73];
                        ray->u = fVar142;
                        ray->v = fVar24;
                        ray->primID = *(uint *)((long)&local_27e0 + uVar73 * 4);
                        ray->geomID = uVar69;
                        ray->instID[0] = pRVar74->instID[0];
                        ray->instPrimID[0] = pRVar74->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar74 = context->user;
                    }
                    local_2940._0_8_ = context->args;
                    local_2870 = local_2680[uVar73];
                    local_286c = local_2660[uVar73];
                    local_2868 = local_2640[uVar73];
                    local_2864 = *(undefined4 *)(local_26e0 + uVar73 * 4);
                    local_2860 = *(undefined4 *)(local_26c0 + uVar73 * 4);
                    local_285c = *(undefined4 *)((long)&local_27e0 + uVar73 * 4);
                    local_2858 = uVar69;
                    local_2854 = pRVar74->instID[0];
                    local_2850 = pRVar74->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_26a0 + uVar73 * 4);
                    local_2944 = -1;
                    local_2910.valid = &local_2944;
                    local_2910.geometryUserPtr = pGVar9->userPtr;
                    local_2910.context = pRVar74;
                    local_2910.ray = (RTCRayN *)ray;
                    local_2910.hit = (RTCHitN *)&local_2870;
                    local_2910.N = 1;
                    local_2800._0_8_ = pGVar9;
                    local_2820._0_8_ = uVar73;
                    if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_014e0f4b:
                      if ((*(code **)(local_2940._0_8_ + 0x10) != (code *)0x0) &&
                         (((*(byte *)local_2940._0_8_ & 2) != 0 ||
                          ((*(byte *)(local_2800._0_8_ + 0x3e) & 0x40) != 0)))) {
                        (**(code **)(local_2940._0_8_ + 0x10))(&local_2910);
                        uVar73 = local_2820._0_8_;
                        if (*local_2910.valid == 0) goto LAB_014e1005;
                      }
                      (((Vec3f *)((long)local_2910.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2910.hit;
                      (((Vec3f *)((long)local_2910.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2910.hit + 4);
                      (((Vec3f *)((long)local_2910.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2910.hit + 8);
                      *(float *)((long)local_2910.ray + 0x3c) = *(float *)(local_2910.hit + 0xc);
                      *(float *)((long)local_2910.ray + 0x40) = *(float *)(local_2910.hit + 0x10);
                      *(float *)((long)local_2910.ray + 0x44) = *(float *)(local_2910.hit + 0x14);
                      *(float *)((long)local_2910.ray + 0x48) = *(float *)(local_2910.hit + 0x18);
                      *(float *)((long)local_2910.ray + 0x4c) = *(float *)(local_2910.hit + 0x1c);
                      *(float *)((long)local_2910.ray + 0x50) = *(float *)(local_2910.hit + 0x20);
                    }
                    else {
                      (*pGVar9->intersectionFilterN)(&local_2910);
                      uVar73 = local_2820._0_8_;
                      if (*local_2910.valid != 0) goto LAB_014e0f4b;
LAB_014e1005:
                      (ray->super_RayK<1>).tfar = (float)local_28e0._0_4_;
                      uVar73 = local_2820._0_8_;
                    }
                    fVar142 = (ray->super_RayK<1>).tfar;
                    auVar90._4_4_ = fVar142;
                    auVar90._0_4_ = fVar142;
                    auVar90._8_4_ = fVar142;
                    auVar90._12_4_ = fVar142;
                    auVar90._16_4_ = fVar142;
                    auVar90._20_4_ = fVar142;
                    auVar90._24_4_ = fVar142;
                    auVar90._28_4_ = fVar142;
                    *(undefined4 *)(local_2840 + uVar73 * 4) = 0;
                    auVar124 = vcmpps_avx(_local_28c0,auVar90,2);
                    local_2840 = vandps_avx(auVar124,local_2840);
                    uVar75 = (ray->super_RayK<1>).mask;
                    _local_28e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  }
                  if ((((((((local_2840 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_2840 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_2840 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_2840 >> 0x7f,0) == '\0') &&
                        (local_2840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_2840 >> 0xbf,0) == '\0') &&
                      (local_2840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_2840[0x1f]) break;
                  local_2940._0_4_ = uVar75;
                  BVHNIntersector1<8,1048576,false,embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_2910);
                  uVar69 = (uint)local_2910.valid;
                  uVar75 = local_2940._0_4_;
                } while( true );
              }
            }
            lVar83 = lVar83 + 1;
          } while (lVar83 != local_2888);
        }
        fVar142 = (ray->super_RayK<1>).tfar;
        auVar91 = ZEXT3264(CONCAT428(fVar142,CONCAT424(fVar142,CONCAT420(fVar142,CONCAT416(fVar142,
                                                  CONCAT412(fVar142,CONCAT48(fVar142,CONCAT44(
                                                  fVar142,fVar142))))))));
        auVar216 = ZEXT3264(local_2560);
        auVar218 = ZEXT3264(local_2580);
        auVar224 = ZEXT3264(local_25a0);
        auVar238 = ZEXT3264(local_25c0);
        auVar240 = ZEXT3264(local_25e0);
        auVar243 = ZEXT3264(local_2600);
      }
    } while (pauVar71 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }